

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void stbtt__rasterize(stbtt__bitmap *result,stbtt__point *pts,int *wcount,int windings,float scale_x
                     ,float scale_y,float shift_x,float shift_y,int off_x,int off_y,int invert,
                     void *userdata)

{
  float *pfVar1;
  float fVar2;
  void *pvVar3;
  long lVar4;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  int in_stack_00000008;
  int b;
  int a;
  stbtt__point *p;
  int vsubsample;
  int m;
  int k;
  int j;
  int i;
  int n;
  stbtt__edge *e;
  float y_scale_inv;
  int in_stack_00000208;
  int in_stack_0000020c;
  int in_stack_00000210;
  int in_stack_00000214;
  stbtt__edge *in_stack_00000218;
  stbtt__bitmap *in_stack_00000220;
  void *in_stack_00000230;
  void *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  float fVar5;
  int local_68;
  int local_64;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  
  if (in_stack_00000008 != 0) {
    in_XMM1_Da = -in_XMM1_Da;
  }
  for (local_48 = 0; local_48 < in_ECX; local_48 = local_48 + 1) {
  }
  fVar5 = in_XMM1_Da;
  pvVar3 = nk_stbtt_malloc(CONCAT44(in_XMM1_Da,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88)
  ;
  if (pvVar3 != (void *)0x0) {
    local_44 = 0;
    local_54 = 0;
    for (local_48 = 0; local_48 < in_ECX; local_48 = local_48 + 1) {
      lVar4 = in_RSI + (long)local_54 * 8;
      local_54 = *(int *)(in_RDX + (long)local_48 * 4) + local_54;
      local_4c = *(int *)(in_RDX + (long)local_48 * 4) + -1;
      for (local_50 = 0; local_50 < *(int *)(in_RDX + (long)local_48 * 4); local_50 = local_50 + 1)
      {
        local_64 = local_50;
        local_68 = local_4c;
        fVar2 = *(float *)(lVar4 + 4 + (long)local_4c * 8);
        pfVar1 = (float *)(lVar4 + 4 + (long)local_50 * 8);
        if ((fVar2 != *pfVar1) || (NAN(fVar2) || NAN(*pfVar1))) {
          *(undefined4 *)((long)pvVar3 + (long)local_44 * 0x14 + 0x10) = 0;
          if (in_stack_00000008 == 0) {
            if (*(float *)(lVar4 + 4 + (long)local_4c * 8) <
                *(float *)(lVar4 + 4 + (long)local_50 * 8)) goto LAB_001193cb;
          }
          else {
            fVar2 = *(float *)(lVar4 + 4 + (long)local_4c * 8);
            pfVar1 = (float *)(lVar4 + 4 + (long)local_50 * 8);
            if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
LAB_001193cb:
              *(undefined4 *)((long)pvVar3 + (long)local_44 * 0x14 + 0x10) = 1;
              local_64 = local_4c;
              local_68 = local_50;
            }
          }
          *(float *)((long)pvVar3 + (long)local_44 * 0x14) =
               *(float *)(lVar4 + (long)local_64 * 8) * in_XMM0_Da + in_XMM2_Da;
          *(float *)((long)pvVar3 + (long)local_44 * 0x14 + 4) =
               (*(float *)(lVar4 + 4 + (long)local_64 * 8) * in_XMM1_Da + in_XMM3_Da) * 1.0;
          *(float *)((long)pvVar3 + (long)local_44 * 0x14 + 8) =
               *(float *)(lVar4 + (long)local_68 * 8) * in_XMM0_Da + in_XMM2_Da;
          *(float *)((long)pvVar3 + (long)local_44 * 0x14 + 0xc) =
               (*(float *)(lVar4 + 4 + (long)local_68 * 8) * in_XMM1_Da + in_XMM3_Da) * 1.0;
          local_44 = local_44 + 1;
        }
        local_4c = local_50;
      }
    }
    stbtt__sort_edges((stbtt__edge *)CONCAT44(fVar5,in_stack_ffffffffffffff90),
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    stbtt__rasterize_sorted_edges
              (in_stack_00000220,in_stack_00000218,in_stack_00000214,in_stack_00000210,
               in_stack_0000020c,in_stack_00000208,in_stack_00000230);
    nk_stbtt_free((void *)CONCAT44(fVar5,in_stack_ffffffffffffff90),_b);
  }
  return;
}

Assistant:

static void stbtt__rasterize(stbtt__bitmap *result, stbtt__point *pts, int *wcount, int windings, float scale_x, float scale_y, float shift_x, float shift_y, int off_x, int off_y, int invert, void *userdata)
{
float y_scale_inv = invert ? -scale_y : scale_y;
stbtt__edge *e;
int n,i,j,k,m;
#if STBTT_RASTERIZER_VERSION == 1
int vsubsample = result->h < 8 ? 15 : 5;
#elif STBTT_RASTERIZER_VERSION == 2
int vsubsample = 1;
#else
#error "Unrecognized value of STBTT_RASTERIZER_VERSION"
#endif
/*  vsubsample should divide 255 evenly; otherwise we won't reach full opacity */

/*  now we have to blow out the windings into explicit edge lists */
n = 0;
for (i=0; i < windings; ++i)
n += wcount[i];

e = (stbtt__edge *) STBTT_malloc(sizeof(*e) * (n+1), userdata); /*  add an extra one as a sentinel */
if (e == 0) return;
n = 0;

m=0;
for (i=0; i < windings; ++i) {
stbtt__point *p = pts + m;
m += wcount[i];
j = wcount[i]-1;
for (k=0; k < wcount[i]; j=k++) {
int a=k,b=j;
/*  skip the edge if horizontal */
if (p[j].y == p[k].y)
continue;
/*  add edge from j to k to the list */
e[n].invert = 0;
if (invert ? p[j].y > p[k].y : p[j].y < p[k].y) {
e[n].invert = 1;
a=j,b=k;
}
e[n].x0 = p[a].x * scale_x + shift_x;
e[n].y0 = (p[a].y * y_scale_inv + shift_y) * vsubsample;
e[n].x1 = p[b].x * scale_x + shift_x;
e[n].y1 = (p[b].y * y_scale_inv + shift_y) * vsubsample;
++n;
}
}

/*  now sort the edges by their highest point (should snap to integer, and then by x) */
/* STBTT_sort(e, n, sizeof(e[0]), stbtt__edge_compare); */
stbtt__sort_edges(e, n);

/*  now, traverse the scanlines and find the intersections on each scanline, use xor winding rule */
stbtt__rasterize_sorted_edges(result, e, n, vsubsample, off_x, off_y, userdata);

STBTT_free(e, userdata);
}